

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

bool __thiscall amrex::ParmParse::contains(ParmParse *this,char *name)

{
  char *pcVar1;
  bool bVar2;
  pointer pPVar3;
  char *in_RSI;
  const_list_iterator lli;
  const_list_iterator End;
  const_list_iterator li;
  PP_entry *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  byte in_stack_fffffffffffffed7;
  allocator local_f1;
  string local_f0 [8];
  string *in_stack_ffffffffffffff18;
  ParmParse *in_stack_ffffffffffffff20;
  string local_d0 [32];
  iterator local_b0;
  _List_const_iterator<amrex::ParmParse::PP_entry> local_a8;
  iterator local_a0;
  _List_const_iterator<amrex::ParmParse::PP_entry> local_98 [3];
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  _List_const_iterator<amrex::ParmParse::PP_entry> local_30;
  iterator local_28;
  _List_const_iterator<amrex::ParmParse::PP_entry> local_20;
  char *local_18;
  
  local_18 = in_RSI;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
       begin((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
             in_stack_fffffffffffffec8);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator(&local_20,&local_28);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
       end((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
           in_stack_fffffffffffffec8);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator(&local_30,&local_38);
  while( true ) {
    bVar2 = std::operator!=(&local_20,&local_30);
    pcVar1 = local_18;
    if (!bVar2) {
      return false;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar1,&local_79);
    prefixedName(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator*
              ((_List_const_iterator<amrex::ParmParse::PP_entry> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    bVar2 = anon_unknown_12::ppfound
                      ((string *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,false);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (bVar2) break;
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator++(&local_20);
  }
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
       begin((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
             in_stack_fffffffffffffec8);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator(local_98,&local_a0);
  while( true ) {
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
         ::end((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
               in_stack_fffffffffffffec8);
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator(&local_a8,&local_b0)
    ;
    bVar2 = std::operator!=(local_98,&local_a8);
    pcVar1 = local_18;
    if (!bVar2) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,pcVar1,&local_f1);
    prefixedName(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator*
              ((_List_const_iterator<amrex::ParmParse::PP_entry> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    in_stack_fffffffffffffed7 =
         anon_unknown_12::ppfound
                   ((string *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffec8,false);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    if ((in_stack_fffffffffffffed7 & 1) != 0) {
      pPVar3 = std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator->
                         ((_List_const_iterator<amrex::ParmParse::PP_entry> *)0x11b27c6);
      pPVar3->m_queried = true;
    }
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator++(local_98);
  }
  return true;
}

Assistant:

bool
ParmParse::contains (const char* name) const
{
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
       if ( ppfound(prefixedName(name), *li, false))
       {
           //
           // Found an entry; mark all occurrences of name as used.
           //
           for ( const_list_iterator lli = m_table.begin(); lli != m_table.end(); ++lli )
           {
               if ( ppfound(prefixedName(name), *lli, false) )
               {
                   lli->m_queried = true;
               }
           }
           return true;
       }
    }
    return false;
}